

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

uint32_t __thiscall wasm::WasmBinaryWriter::getTagIndex(WasmBinaryWriter *this,Name name)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_28;
  const_iterator it;
  WasmBinaryWriter *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  it.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::find(&(this->indexes).tagIndexes,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::end(&(this->indexes).tagIndexes);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    __assert_fail("it != indexes.tagIndexes.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x2c1,"uint32_t wasm::WasmBinaryWriter::getTagIndex(Name) const");
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::operator->
                     ((_Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>
                       *)&local_28);
  return pvVar2->second;
}

Assistant:

uint32_t WasmBinaryWriter::getTagIndex(Name name) const {
  auto it = indexes.tagIndexes.find(name);
  assert(it != indexes.tagIndexes.end());
  return it->second;
}